

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::~PosixRandomAccessFile(PosixRandomAccessFile *this)

{
  PosixRandomAccessFile *this_local;
  
  ~PosixRandomAccessFile(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~PosixRandomAccessFile() { close(fd_); }